

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

PropertyIdArray *
Js::InterpreterStackFrame::OP_NewPropIdArrForCompProps(uint32 size,ScriptContext *scriptContext)

{
  Recycler *pRVar1;
  PropertyIdArray *this;
  TrackAllocData local_50;
  PropertyIdArray *propIdArr;
  ScriptContext *pSStack_18;
  uint extraAlloc;
  ScriptContext *scriptContext_local;
  uint32 size_local;
  
  pSStack_18 = scriptContext;
  scriptContext_local._4_4_ = size;
  propIdArr._4_4_ = UInt32Math::Mul(size,4);
  pRVar1 = ScriptContext::GetRecycler(pSStack_18);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&PropertyIdArray::typeinfo,(ulong)propIdArr._4_4_,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
             ,0x167c);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  this = (PropertyIdArray *)new<Memory::Recycler>(8,pRVar1,0x446eb0,0);
  PropertyIdArray::PropertyIdArray(this,scriptContext_local._4_4_,'\0',false,false,false);
  return this;
}

Assistant:

Js::PropertyIdArray * InterpreterStackFrame::OP_NewPropIdArrForCompProps(uint32 size, ScriptContext* scriptContext)
    {
        uint extraAlloc = UInt32Math::Mul(size, sizeof(Js::PropertyId));
        Js::PropertyIdArray * propIdArr = RecyclerNewPlusLeaf(scriptContext->GetRecycler(), extraAlloc, Js::PropertyIdArray, size, 0);
        return propIdArr;
    }